

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_average_down_boundaries(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  FabFactory<amrex::FArrayBox> *pFVar10;
  Periodicity *period;
  MFItInfo *this;
  int *piVar11;
  DistributionMapping *dm;
  BoxArray *pBVar12;
  undefined4 in_ECX;
  MultiFab *in_RDX;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  MultiFab ctmp;
  BoxArray cba;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *ba;
  Array4<const_double> *fa;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *ca;
  Box result;
  FabType typ;
  Box *tbx;
  MFIter mfi;
  MFItInfo info;
  MultiCutFab *barea;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Dim3 dratio;
  int ncomp;
  Real tmp;
  int ii;
  int jj;
  int kk;
  Real cv;
  Real c;
  int n_1;
  IntVect shft;
  BoxArray *in_stack_fffffffffffff678;
  MultiCutFab *in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff698;
  int in_stack_fffffffffffff6a0;
  int in_stack_fffffffffffff6a4;
  FabArrayBase *in_stack_fffffffffffff6a8;
  undefined1 *puVar13;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff6b0;
  IntVect *in_stack_fffffffffffff6c0;
  MultiFab *this_00;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff6d0;
  long *plVar14;
  undefined8 in_stack_fffffffffffff6d8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff6e0;
  long *plVar15;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff6e8;
  MFIter *in_stack_fffffffffffff6f0;
  MFIter *pMVar16;
  int in_stack_fffffffffffff700;
  CpOp op;
  _func_int **local_8e8;
  BATransformer BStack_8e0;
  Box *in_stack_fffffffffffff7a0;
  EBCellFlagFab *in_stack_fffffffffffff7a8;
  BoxArray local_738;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  undefined8 local_6b0;
  int local_6a8;
  undefined8 local_69c;
  int local_694;
  FabArrayBase *local_690;
  int local_688;
  FabArrayBase *local_680;
  int local_678;
  long local_670 [8];
  long *local_630;
  long local_628 [8];
  long *local_5e8;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  undefined8 local_5d0;
  int local_5c8;
  undefined8 local_5bc;
  int local_5b4;
  FabArrayBase *local_5b0;
  int local_5a8;
  FabArrayBase *local_5a0;
  int local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  int local_570;
  int local_56c;
  int local_568;
  long *local_550;
  undefined1 local_544 [24];
  int local_52c;
  FabType local_528;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_524 [3];
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> *local_508;
  MFIter local_500;
  MFItInfo local_49c;
  MultiCutFab *local_488;
  FabArray<amrex::EBCellFlagFab> *local_480;
  Periodicity *local_478;
  _func_int **local_470;
  BATType local_468;
  undefined8 local_45c;
  BATType ngcrse_00;
  int iVar17;
  undefined4 uVar18;
  int local_334;
  int local_330;
  int local_32c;
  double local_328;
  double local_320;
  int local_318;
  int local_1a0;
  int iStack_19c;
  int local_198;
  IntVect local_194;
  MultiFab *local_188;
  MFIter *local_180;
  undefined4 local_174;
  int local_168 [2];
  int local_160;
  int *local_158;
  IntVect local_14c;
  IntVect *local_140;
  int *local_138;
  undefined4 local_12c;
  IntVect *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  int *local_100;
  IntVect *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  MultiFab *local_c0;
  int *local_b8;
  undefined4 local_ac;
  MultiFab *local_a8;
  undefined4 local_9c;
  MultiFab *local_98;
  undefined4 local_8c;
  MultiFab *local_88;
  MultiFab *local_80;
  MFIter *local_78;
  undefined4 local_6c;
  MultiFab *local_68;
  undefined4 local_5c;
  MultiFab *local_58;
  undefined4 local_4c;
  MultiFab *local_48;
  IntVect *local_40;
  int *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  iVar17 = (int)((ulong)in_stack_fffffffffffff698 >> 0x20);
  iVar9 = FabArrayBase::nComp(in_RSI);
  bVar8 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_fffffffffffff690);
  if (bVar8) {
    local_470 = (in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase;
    local_468 = (in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                m_bat_type;
    local_45c = local_470;
    ngcrse_00 = local_468;
    pFVar10 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x114f17c);
    period = (Periodicity *)
             __dynamic_cast(pFVar10,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (period == (Periodicity *)0x0) {
      __cxa_bad_cast();
    }
    local_478 = period;
    local_480 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff680);
    local_488 = EBFArrayBoxFactory::getBndryArea((EBFArrayBoxFactory *)in_stack_fffffffffffff680);
    bVar8 = isMFIterSafe(&in_stack_fffffffffffff690->super_FabArrayBase,
                         (FabArrayBase *)
                         CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if (bVar8) {
      MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff690);
      this = MFItInfo::EnableTiling(&local_49c,(IntVect *)&FabArrayBase::mfiter_tile_size);
      MFItInfo::SetDynamic(this,true);
      MFIter::MFIter((MFIter *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
                     (MFItInfo *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
      while( true ) {
        iVar17 = (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
        bVar8 = MFIter::isValid(&local_500);
        if (!bVar8) break;
        MFIter::growntilebox(in_stack_fffffffffffff6f0,iVar17);
        local_508 = local_524;
        in_stack_fffffffffffff6e8 =
             (FabArray<amrex::FArrayBox> *)
             FabArray<amrex::EBCellFlagFab>::operator[]
                       ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff680,
                        (MFIter *)in_stack_fffffffffffff678);
        local_544._0_8_ = local_508->_M_head_impl;
        local_544._8_8_ = local_508[1]._M_head_impl;
        local_544._16_8_ = local_508[2]._M_head_impl;
        local_52c = *(int *)&local_508[3]._M_head_impl;
        in_stack_fffffffffffff6f0 = (MFIter *)local_544;
        local_174 = 1;
        bVar8 = true;
        if ((*(int *)&(in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                      _vptr_FabArrayBase == 1) &&
           (bVar8 = true,
           *(int *)((long)&(in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           _vptr_FabArrayBase + 4) == 1)) {
          bVar8 = (in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                  m_bat_type != indexType;
        }
        local_180 = in_stack_fffffffffffff6f0;
        if (bVar8) {
          local_188 = in_RDX;
          IntVect::IntVect(&local_194,1);
          local_158 = (in_stack_fffffffffffff6f0->tile_size).vect + 2;
          uVar2 = *local_158;
          IntVect::IntVect(&local_14c,uVar2 & 1,uVar2 >> 1 & 1,uVar2 >> 2 & 1);
          local_160 = local_14c.vect[2];
          local_168[0] = local_14c.vect[0];
          local_168[1] = local_14c.vect[1];
          local_1a0 = local_14c.vect[0];
          iStack_19c = local_14c.vect[1];
          uVar6 = _local_1a0;
          local_198 = local_14c.vect[2];
          local_f8 = &local_194;
          local_100 = &local_1a0;
          local_cc = 0;
          local_1a0 = local_14c.vect[0];
          local_194.vect[0] = local_194.vect[0] - local_1a0;
          local_dc = 1;
          iStack_19c = local_14c.vect[1];
          local_194.vect[1] = local_194.vect[1] - iStack_19c;
          local_ec = 2;
          local_194.vect[2] = local_194.vect[2] - local_14c.vect[2];
          local_80 = local_188;
          local_48 = local_188;
          local_4c = 0;
          pMVar16 = in_stack_fffffffffffff6f0;
          _local_1a0 = uVar6;
          local_e8 = local_100;
          local_d8 = local_100;
          local_c8 = local_100;
          local_78 = in_stack_fffffffffffff6f0;
          *(int *)&(in_stack_fffffffffffff6f0->m_fa)._M_t.
                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               *(int *)&(local_188->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        _vptr_FabArrayBase *
               *(int *)&(in_stack_fffffffffffff6f0->m_fa)._M_t.
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          local_58 = local_80;
          local_5c = 1;
          *(int *)((long)&(in_stack_fffffffffffff6f0->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4) =
               *(int *)((long)&(local_80->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase + 4) *
               *(int *)((long)&(in_stack_fffffffffffff6f0->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4
                       );
          local_68 = local_80;
          local_6c = 2;
          *(BATType *)&in_stack_fffffffffffff6f0->fabArray =
               (local_80->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
               m_bat_type * *(int *)&in_stack_fffffffffffff6f0->fabArray;
          local_38 = (int *)((long)&in_stack_fffffffffffff6f0->fabArray + 4);
          local_40 = &local_194;
          local_c = 0;
          local_8 = local_40;
          *local_38 = local_194.vect[0] + *local_38;
          local_18 = local_40;
          local_1c = 1;
          (in_stack_fffffffffffff6f0->tile_size).vect[0] =
               local_40->vect[1] + (in_stack_fffffffffffff6f0->tile_size).vect[0];
          local_28 = local_40;
          local_2c = 2;
          (in_stack_fffffffffffff6f0->tile_size).vect[1] =
               local_40->vect[2] + (in_stack_fffffffffffff6f0->tile_size).vect[1];
          local_b8 = (int *)((long)&in_stack_fffffffffffff6f0->fabArray + 4);
          local_c0 = local_188;
          local_88 = local_188;
          local_8c = 0;
          *local_b8 = *(int *)&(local_188->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase * *local_b8;
          local_98 = local_c0;
          local_9c = 1;
          (in_stack_fffffffffffff6f0->tile_size).vect[0] =
               *(int *)((long)&(local_c0->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase + 4) *
               (in_stack_fffffffffffff6f0->tile_size).vect[0];
          local_a8 = local_c0;
          local_ac = 2;
          (in_stack_fffffffffffff6f0->tile_size).vect[1] =
               (local_c0->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
               m_bat_type * (in_stack_fffffffffffff6f0->tile_size).vect[1];
          local_138 = (int *)((long)&in_stack_fffffffffffff6f0->fabArray + 4);
          local_140 = &local_194;
          local_10c = 0;
          local_108 = local_140;
          *local_138 = *local_138 - local_194.vect[0];
          local_118 = local_140;
          local_11c = 1;
          (in_stack_fffffffffffff6f0->tile_size).vect[0] =
               (in_stack_fffffffffffff6f0->tile_size).vect[0] - local_140->vect[1];
          local_128 = local_140;
          local_12c = 2;
          (in_stack_fffffffffffff6f0->tile_size).vect[1] =
               (in_stack_fffffffffffff6f0->tile_size).vect[1] - local_140->vect[2];
          in_stack_fffffffffffff6f0 = pMVar16;
        }
        local_528 = EBCellFlagFab::getType(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                   (MFIter *)in_stack_fffffffffffff680);
        local_550 = &local_590;
        if ((local_528 == covered) || (local_528 == regular)) {
          iVar17 = *(int *)&local_508->_M_head_impl;
          iVar3 = *(int *)((long)&local_508->_M_head_impl + 4);
          local_5b0 = local_508->_M_head_impl;
          local_5a8 = *(int *)&local_508[1]._M_head_impl;
          piVar11 = (int *)((long)&local_508[1]._M_head_impl + 4);
          iVar4 = *piVar11;
          iVar5 = *(int *)&local_508[2]._M_head_impl;
          local_5d0 = *(undefined8 *)piVar11;
          local_5c8 = *(int *)((long)&local_508[2]._M_head_impl + 4);
          for (local_5d4 = 0; iVar7 = local_5a8, local_5bc = local_5d0, local_5b4 = local_5c8,
              local_5a0 = local_5b0, local_598 = local_5a8, local_5d4 < iVar9;
              local_5d4 = local_5d4 + 1) {
            while (local_5d8 = iVar7, iVar7 = iVar3, local_5d8 <= local_5c8) {
              while (local_5dc = iVar7, iVar7 = iVar17, local_5dc <= iVar5) {
                while (local_5e0 = iVar7, local_5e0 <= iVar4) {
                  *(undefined8 *)
                   (local_590 +
                   ((long)(local_5e0 - local_570) + (local_5dc - local_56c) * local_588 +
                    (local_5d8 - local_568) * local_580 + local_5d4 * local_578) * 8) = 0;
                  iVar7 = local_5e0 + 1;
                }
                iVar7 = local_5dc + 1;
              }
              iVar7 = local_5d8 + 1;
            }
          }
        }
        else {
          plVar14 = local_628;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                     (MFIter *)in_stack_fffffffffffff680);
          plVar15 = local_670;
          local_5e8 = plVar14;
          MultiCutFab::const_array(in_stack_fffffffffffff680,(MFIter *)in_stack_fffffffffffff678);
          iVar17 = *(int *)&local_508->_M_head_impl;
          iVar3 = *(int *)((long)&local_508->_M_head_impl + 4);
          local_690 = local_508->_M_head_impl;
          piVar11 = (int *)((long)&local_508[1]._M_head_impl + 4);
          iVar4 = *piVar11;
          iVar5 = *(int *)&local_508[2]._M_head_impl;
          local_6b0 = *(undefined8 *)piVar11;
          local_6a8 = *(int *)((long)&local_508[2]._M_head_impl + 4);
          local_688 = *(int *)&local_508[1]._M_head_impl;
          for (local_6b4 = local_688; iVar7 = iVar3, local_69c = local_6b0, local_694 = local_6a8,
              local_680 = local_690, local_678 = local_688, local_630 = plVar15,
              local_6b4 <= local_6a8; local_6b4 = local_6b4 + 1) {
            while (local_6b8 = iVar7, iVar7 = iVar17, local_6b8 <= iVar5) {
              while (local_6bc = iVar7, local_6bc <= iVar4) {
                for (local_318 = 0; local_318 < iVar9; local_318 = local_318 + 1) {
                  local_320 = 0.0;
                  local_328 = 0.0;
                  for (local_32c = local_6b4 * ngcrse_00;
                      local_32c < (int)((local_6b4 + 1) * ngcrse_00); local_32c = local_32c + 1) {
                    for (local_330 = local_6b8 * local_45c._4_4_;
                        local_330 < (local_6b8 + 1) * local_45c._4_4_; local_330 = local_330 + 1) {
                      for (local_334 = local_6bc * (int)local_45c;
                          local_334 < (local_6bc + 1) * (int)local_45c; local_334 = local_334 + 1) {
                        dVar1 = *(double *)
                                 (*plVar15 +
                                 ((long)(local_334 - (int)plVar15[4]) +
                                  (long)(local_330 - *(int *)((long)plVar15 + 0x24)) * plVar15[1] +
                                 (long)(local_32c - (int)plVar15[5]) * plVar15[2]) * 8);
                        local_320 = *(double *)
                                     (*local_5e8 +
                                     ((long)(local_334 - (int)local_5e8[4]) +
                                      (long)(local_330 - *(int *)((long)local_5e8 + 0x24)) *
                                      local_5e8[1] +
                                      (long)(local_32c - (int)local_5e8[5]) * local_5e8[2] +
                                     (long)local_318 * local_5e8[3]) * 8) * dVar1 + local_320;
                        local_328 = dVar1 + local_328;
                      }
                    }
                  }
                  if (local_328 <= 1e-30) {
                    *(undefined8 *)
                     (*local_550 +
                     ((long)(local_6bc - (int)local_550[4]) +
                      (long)(local_6b8 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
                      (long)(local_6b4 - (int)local_550[5]) * local_550[2] +
                     (long)local_318 * local_550[3]) * 8) = 0;
                  }
                  else {
                    *(double *)
                     (*local_550 +
                     ((long)(local_6bc - (int)local_550[4]) +
                      (long)(local_6b8 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
                      (long)(local_6b4 - (int)local_550[5]) * local_550[2] +
                     (long)local_318 * local_550[3]) * 8) = local_320 / local_328;
                  }
                }
                iVar7 = local_6bc + 1;
              }
              iVar7 = local_6b8 + 1;
            }
          }
        }
        MFIter::operator++(&local_500);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff680);
    }
    else {
      FabArrayBase::boxArray(in_RDI);
      pBVar12 = &local_738;
      BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
      BoxArray::coarsen(pBVar12,in_stack_fffffffffffff6c0);
      dm = FabArrayBase::DistributionMap(in_RDI);
      BStack_8e0.m_op._4_8_ = 0;
      BStack_8e0.m_op._12_8_ = 0;
      local_8e8 = (_func_int **)0x0;
      BStack_8e0._0_8_ = 0;
      BStack_8e0.m_op._20_8_ = 0;
      this_00 = (MultiFab *)&local_8e8;
      iVar17 = iVar9;
      uVar18 = in_ECX;
      MFInfo::MFInfo((MFInfo *)0x11504e6);
      op = COPY;
      puVar13 = &stack0xfffffffffffff710;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff680);
      MultiFab::MultiFab(this_00,(BoxArray *)CONCAT44(in_ECX,iVar9),dm,(int)((ulong)puVar13 >> 0x20)
                         ,(int)puVar13,
                         (MFInfo *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                         in_stack_fffffffffffff6d0);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x1150546);
      MFInfo::~MFInfo((MFInfo *)0x1150553);
      EB_average_down_boundaries
                ((MultiFab *)in_RSI,in_RDX,(IntVect *)CONCAT44(uVar18,iVar17),ngcrse_00);
      pBVar12 = (BoxArray *)Periodicity::NonPeriodic();
      FabArray<amrex::FArrayBox>::ParallelCopy
                (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                 (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),(int)in_stack_fffffffffffff6d8,
                 (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff700,period,op);
      MultiFab::~MultiFab((MultiFab *)0x11505e4);
      BoxArray::~BoxArray(pBVar12);
    }
  }
  else {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff6b0,(value_type)in_stack_fffffffffffff6a8,
               in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0,iVar17);
  }
  return;
}

Assistant:

void EB_average_down_boundaries (const MultiFab& fine, MultiFab& crse,
                                 const IntVect& ratio, int ngcrse)
{
    int ncomp = crse.nComp();

    if (!fine.hasEBFabFactory())
    {
        crse.setVal(0.0, 0, ncomp, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fine.Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& barea = factory.getBndryArea();

        if (isMFIterSafe(fine, crse))
        {
            MFItInfo info;
            if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse, info); mfi.isValid(); ++mfi)
            {
                const Box& tbx = mfi.growntilebox(ngcrse);
                FabType typ = flags[mfi].getType(amrex::refine(tbx,ratio));
                Array4<Real> const& ca = crse.array(mfi);
                if (FabType::covered == typ || FabType::regular == typ) {
                    AMREX_HOST_DEVICE_FOR_4D(tbx,ncomp,i,j,k,n,
                    {
                        ca(i,j,k,n) = 0.0;
                    });
                } else {
                    Array4<Real const> const& fa = fine.const_array(mfi);
                    Array4<Real const> const& ba = barea.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                    {
                        eb_avgdown_boundaries(i,j,k,fa,0,ca,0,ba,dratio,ncomp);
                    });
                }
            }
        }
        else
        {
            BoxArray cba = fine.boxArray();
            cba.coarsen(ratio);
            MultiFab ctmp(cba, fine.DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            EB_average_down_boundaries(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp, 0, 0, ncomp, ngcrse, ngcrse);
        }
    }
}